

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3EvalNearTrim(int nNear,char *aTmp,char **paPoslist,int *pnToken,Fts3Phrase *pPhrase)

{
  byte *pbVar1;
  char *pcVar2;
  int iVar3;
  byte *pbVar4;
  char *pcVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  byte *pbVar9;
  char *p2;
  char *aTmp2;
  char *pTmp2;
  char *pTmp1;
  char *local_60;
  char *local_58;
  byte *local_50;
  char *local_48;
  byte *local_40;
  byte *local_38;
  
  iVar3 = *pnToken;
  pcVar2 = (pPhrase->doclist).pList;
  pcVar5 = *paPoslist;
  local_60 = pcVar2;
  local_58 = pcVar2;
  local_48 = aTmp;
  local_38 = (byte *)aTmp;
  fts3PoslistPhraseMerge((char **)&local_38,pPhrase->nToken + nNear,0,0,paPoslist,&local_58);
  pbVar9 = local_38;
  local_40 = local_38;
  local_50 = local_38;
  *paPoslist = pcVar5;
  local_58 = pcVar2;
  fts3PoslistPhraseMerge((char **)&local_40,nNear + iVar3,1,0,&local_58,paPoslist);
  if (pbVar9 == (byte *)aTmp) {
    if (local_40 == (byte *)aTmp) {
      return 0;
    }
    bVar7 = *pbVar9;
    pbVar4 = pbVar9;
    if (bVar7 != 0) {
      do {
        pbVar1 = pbVar4 + 1;
        pbVar4 = pbVar4 + 1;
        bVar8 = bVar7 & 0x80;
        bVar7 = *pbVar1;
      } while (bVar8 != 0 || *pbVar1 != 0);
    }
    iVar3 = (int)pbVar4 - (int)aTmp;
  }
  else {
    if (local_40 != pbVar9) {
      fts3PoslistMerge(&local_60,&local_48,(char **)&local_50);
      iVar3 = (int)local_60;
      goto LAB_001c0d75;
    }
    bVar7 = *aTmp;
    pcVar5 = aTmp;
    if (bVar7 != 0) {
      do {
        pbVar9 = (byte *)(pcVar5 + 1);
        pcVar5 = pcVar5 + 1;
        bVar8 = bVar7 & 0x80;
        bVar7 = *pbVar9;
      } while (bVar8 != 0 || *pbVar9 != 0);
    }
    iVar3 = (int)pcVar5 - (int)aTmp;
    pbVar9 = (byte *)aTmp;
  }
  memcpy(pcVar2,pbVar9,(long)(iVar3 + 1));
  iVar3 = (int)pcVar2 + iVar3 + 1;
LAB_001c0d75:
  pcVar2 = (pPhrase->doclist).pList;
  lVar6 = (long)(iVar3 - (int)pcVar2) + -1;
  iVar3 = (int)lVar6;
  memset(pcVar2 + iVar3,0,(pPhrase->doclist).nList - lVar6);
  (pPhrase->doclist).nList = iVar3;
  *paPoslist = (pPhrase->doclist).pList;
  *pnToken = pPhrase->nToken;
  return 1;
}

Assistant:

static int fts3EvalNearTrim(
  int nNear,                      /* NEAR distance. As in "NEAR/nNear". */
  char *aTmp,                     /* Temporary space to use */
  char **paPoslist,               /* IN/OUT: Position list */
  int *pnToken,                   /* IN/OUT: Tokens in phrase of *paPoslist */
  Fts3Phrase *pPhrase             /* The phrase object to trim the doclist of */
){
  int nParam1 = nNear + pPhrase->nToken;
  int nParam2 = nNear + *pnToken;
  int nNew;
  char *p2; 
  char *pOut; 
  int res;

  assert( pPhrase->doclist.pList );

  p2 = pOut = pPhrase->doclist.pList;
  res = fts3PoslistNearMerge(
    &pOut, aTmp, nParam1, nParam2, paPoslist, &p2
  );
  if( res ){
    nNew = (int)(pOut - pPhrase->doclist.pList) - 1;
    assert( pPhrase->doclist.pList[nNew]=='\0' );
    assert( nNew<=pPhrase->doclist.nList && nNew>0 );
    memset(&pPhrase->doclist.pList[nNew], 0, pPhrase->doclist.nList - nNew);
    pPhrase->doclist.nList = nNew;
    *paPoslist = pPhrase->doclist.pList;
    *pnToken = pPhrase->nToken;
  }

  return res;
}